

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentSizeInitialCase::attachmentExists
          (AttachmentSizeInitialCase *this,GLenum attachment)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  StateQueryMemoryWriteGuard<int> state;
  undefined8 local_1c;
  undefined4 local_14;
  
  local_1c = 0xdededededededede;
  local_14 = 0xdededede;
  glu::CallLogWrapper::glGetFramebufferAttachmentParameteriv
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,attachment,0x8cd0,
             (GLint *)((long)&local_1c + 4));
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar3 = true;
  if (local_1c._4_1_ == -0x22) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 3) break;
      uVar1 = uVar2 + 1;
    } while (*(char *)((long)&local_1c + uVar2 + 5) == -0x22);
    bVar3 = uVar2 < 3;
  }
  return (bool)(local_1c._4_4_ != 0 & bVar3);
}

Assistant:

bool attachmentExists (GLenum attachment)
	{
		StateQueryMemoryWriteGuard<GLint> state;
		glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachment, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &state);
		expectError(GL_NO_ERROR);

		return !state.isUndefined() && state != GL_NONE;
	}